

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlDOMWrapNsMapFree(xmlNsMapPtr nsmap)

{
  xmlNsMapItemPtr pxVar1;
  xmlNsMapItemPtr_conflict pxVar2;
  
  if (nsmap != (xmlNsMapPtr)0x0) {
    pxVar2 = nsmap->pool;
    while (pxVar2 != (xmlNsMapItemPtr_conflict)0x0) {
      pxVar1 = pxVar2->next;
      (*xmlFree)(pxVar2);
      pxVar2 = pxVar1;
    }
    pxVar2 = nsmap->first;
    while (pxVar2 != (xmlNsMapItemPtr_conflict)0x0) {
      pxVar1 = pxVar2->next;
      (*xmlFree)(pxVar2);
      pxVar2 = pxVar1;
    }
    (*xmlFree)(nsmap);
    return;
  }
  return;
}

Assistant:

static void
xmlDOMWrapNsMapFree(xmlNsMapPtr nsmap)
{
    xmlNsMapItemPtr cur, tmp;

    if (nsmap == NULL)
	return;
    cur = nsmap->pool;
    while (cur != NULL) {
	tmp = cur;
	cur = cur->next;
	xmlFree(tmp);
    }
    cur = nsmap->first;
    while (cur != NULL) {
	tmp = cur;
	cur = cur->next;
	xmlFree(tmp);
    }
    xmlFree(nsmap);
}